

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void DoHorizontalFilter_SSE2
               (uint8_t *in,int width,int height,int stride,int row,int num_rows,uint8_t *out)

{
  int in_ECX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  char *in_stack_00000008;
  int last_row;
  size_t start_offset;
  int local_18;
  char *local_8;
  
  local_8 = (char *)(in_R8D * in_ECX + in_RDI);
  in_stack_00000008 = (char *)((long)(in_R8D * in_ECX) + (long)in_stack_00000008);
  local_18 = in_R8D;
  if (in_R8D == 0) {
    *in_stack_00000008 = *local_8;
    PredictLineLeft_SSE2((uint8_t *)(local_8 + 1),(uint8_t *)(in_stack_00000008 + 1),in_ESI + -1);
    local_18 = 1;
    local_8 = local_8 + in_ECX;
    in_stack_00000008 = in_stack_00000008 + in_ECX;
  }
  for (; local_18 < in_R8D + in_R9D; local_18 = local_18 + 1) {
    *in_stack_00000008 = *local_8 - local_8[-in_ECX];
    PredictLineLeft_SSE2((uint8_t *)(local_8 + 1),(uint8_t *)(in_stack_00000008 + 1),in_ESI + -1);
    local_8 = local_8 + in_ECX;
    in_stack_00000008 = in_stack_00000008 + in_ECX;
  }
  return;
}

Assistant:

static WEBP_INLINE void DoHorizontalFilter_SSE2(const uint8_t* in,
                                                int width, int height,
                                                int stride,
                                                int row, int num_rows,
                                                uint8_t* out) {
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;

  if (row == 0) {
    // Leftmost pixel is the same as input for topmost scanline.
    out[0] = in[0];
    PredictLineLeft_SSE2(in + 1, out + 1, width - 1);
    row = 1;
    in += stride;
    out += stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    // Leftmost pixel is predicted from above.
    out[0] = in[0] - in[-stride];
    PredictLineLeft_SSE2(in + 1, out + 1, width - 1);
    ++row;
    in += stride;
    out += stride;
  }
}